

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O3

int Fl_X::ewmh_supported(void)

{
  int iVar1;
  Window WVar2;
  unsigned_long **in_R8;
  unsigned_long *words;
  unsigned_long nitems;
  Window *local_20;
  long local_18;
  
  if (ewmh_supported::result != -1) {
    return ewmh_supported::result;
  }
  fl_open_display();
  ewmh_supported::result = 0;
  local_20 = (Window *)0x0;
  WVar2 = XRootWindow(fl_display,fl_screen);
  iVar1 = get_xwinprop(WVar2,fl_NET_SUPPORTING_WM_CHECK,(long)&local_18,(unsigned_long *)&local_20,
                       in_R8);
  if ((iVar1 == 0) && (local_18 == 1)) {
    WVar2 = *local_20;
    XFree();
    local_20 = (Window *)0x0;
    iVar1 = get_xwinprop(WVar2,fl_NET_SUPPORTING_WM_CHECK,(long)&local_18,(unsigned_long *)&local_20
                         ,in_R8);
    if ((iVar1 == 0) && (local_18 == 1)) {
      ewmh_supported::result = (int)(WVar2 == *local_20);
      goto LAB_0018f12a;
    }
  }
  if (local_20 == (Window *)0x0) {
    return ewmh_supported::result;
  }
LAB_0018f12a:
  XFree();
  return ewmh_supported::result;
}

Assistant:

int Fl_X::ewmh_supported() {
  static int result = -1;

  if (result == -1) {
    fl_open_display();
    result = 0;
    unsigned long nitems;
    unsigned long *words = 0;
    if (0 == get_xwinprop(XRootWindow(fl_display, fl_screen), fl_NET_SUPPORTING_WM_CHECK, 64,
                          &nitems, &words) && nitems == 1) {
      Window child = words[0];
      if ( words ) { XFree(words); words = 0; }
      if (0 == get_xwinprop(child, fl_NET_SUPPORTING_WM_CHECK, 64,
                           &nitems, &words) ) {
        if ( nitems == 1) result = (child == words[0]);
      }
    }
    if ( words ) { XFree(words); words = 0; }
  }

  return result;
}